

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O3

Vector<int,_std::allocator<int>_> * __thiscall
amrex::AmrLevel::getBCArray
          (Vector<int,_std::allocator<int>_> *__return_storage_ptr__,AmrLevel *this,int State_Type,
          int gridno,int strt_comp,int ncomp)

{
  int *piVar1;
  pointer piVar2;
  ulong uVar3;
  BCRec local_48;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,(long)(ncomp * 6),
             (allocator_type *)&local_48);
  local_48.bc[0] = -0x29a;
  local_48.bc[1] = -0x29a;
  local_48.bc[2] = -0x29a;
  local_48.bc[3] = -0x29a;
  local_48.bc[4] = -0x29a;
  local_48.bc[5] = -0x29a;
  if (0 < ncomp) {
    uVar3 = 0;
    do {
      StateData::getBC(&local_48,
                       (this->state).
                       super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                       super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                       _M_impl.super__Vector_impl_data._M_start + State_Type,strt_comp,gridno);
      piVar2 = (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      *(undefined8 *)((long)piVar2 + (uVar3 & 0x3fffffff8) + 0x10) = local_48.bc._16_8_;
      piVar1 = (int *)((long)piVar2 + (uVar3 & 0x3fffffff8));
      *(undefined8 *)piVar1 = local_48.bc._0_8_;
      *(undefined8 *)(piVar1 + 2) = local_48.bc._8_8_;
      strt_comp = strt_comp + 1;
      uVar3 = uVar3 + 0x18;
    } while ((ulong)(uint)ncomp * 0x18 != uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<int>
AmrLevel::getBCArray (int State_Type,
                      int gridno,
                      int strt_comp,
                      int ncomp)
{
    Vector<int> bc(2*AMREX_SPACEDIM*ncomp);

    BCRec bcr;

    for (int n = 0; n < ncomp; n++)
    {
        bcr = state[State_Type].getBC(strt_comp+n,gridno);
        const int* b_rec = bcr.vect();
        for (int m = 0; m < 2*AMREX_SPACEDIM; m++)
            bc[2*AMREX_SPACEDIM*n + m] = b_rec[m];
    }

    return bc;
}